

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGeneratorFactory.cxx
# Opt level: O3

void __thiscall
cmCPackGeneratorFactory::RegisterGenerator
          (cmCPackGeneratorFactory *this,string *name,char *generatorDescription,
          CreateGeneratorCall *createGenerator)

{
  char *pcVar1;
  cmCPackLog *this_00;
  mapped_type *ppCVar2;
  mapped_type *pmVar3;
  size_t length;
  ostringstream cmCPackLog_msg;
  long *local_1b8;
  long local_1a8 [2];
  long local_198 [14];
  ios_base local_128 [264];
  
  if (createGenerator != (CreateGeneratorCall *)0x0) {
    ppCVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackGenerator_*(*)(),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackGenerator_*(*)()>_>_>
              ::operator[](&this->GeneratorCreators,name);
    *ppCVar2 = createGenerator;
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->GeneratorDescriptions,name);
    pcVar1 = (char *)pmVar3->_M_string_length;
    strlen(generatorDescription);
    std::__cxx11::string::_M_replace((ulong)pmVar3,0,pcVar1,(ulong)generatorDescription);
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"Cannot register generator",0x19);
  std::ios::widen((char)(ostringstream *)local_198 + (char)*(undefined8 *)(local_198[0] + -0x18));
  std::ostream::put((char)local_198);
  std::ostream::flush();
  this_00 = this->Logger;
  std::__cxx11::stringbuf::str();
  length = strlen((char *)local_1b8);
  cmCPackLog::Log(this_00,0x10,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGeneratorFactory.cxx"
                  ,0xbd,(char *)local_1b8,length);
  if (local_1b8 != local_1a8) {
    operator_delete(local_1b8,local_1a8[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::ios_base::~ios_base(local_128);
  return;
}

Assistant:

void cmCPackGeneratorFactory::RegisterGenerator(
  const std::string& name, const char* generatorDescription,
  CreateGeneratorCall* createGenerator)
{
  if (!createGenerator) {
    cmCPack_Log(this->Logger, cmCPackLog::LOG_ERROR,
                "Cannot register generator" << std::endl);
    return;
  }
  this->GeneratorCreators[name] = createGenerator;
  this->GeneratorDescriptions[name] = generatorDescription;
}